

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

byte * __thiscall
Js::InterpreterStackFrame::OP_ProfiledLoopBodyStart<(Js::LayoutSize)0,true>
          (InterpreterStackFrame *this,uint loopId)

{
  code *pcVar1;
  byte *pbVar2;
  
  *(int *)(this + 0xd0) = *(int *)(this + 0xd0) + 1;
  OP_RecordImplicitCall(this,loopId);
  pcVar1 = *(code **)(this + 0xf8);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)(this + *(long *)(this + 0x100)) + -1);
  }
  (*pcVar1)(this + *(long *)(this + 0x100),loopId,0,0);
  pbVar2 = ByteCodeReader::GetIP((ByteCodeReader *)this);
  return pbVar2;
}

Assistant:

const byte * InterpreterStackFrame::OP_ProfiledLoopBodyStart(uint loopId)
    {
        if (profiled || isAutoProfiling)
        {
            this->currentLoopCounter++;
        }

        if (profiled)
        {
            OP_RecordImplicitCall(loopId);
        }

        (this->*(profiled ? opProfiledLoopBodyStart : opLoopBodyStart))(loopId, layoutSize, false /* isFirstIteration */);
        return m_reader.GetIP();
    }